

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

unsigned_long capnp::(anonymous_namespace)::checkRoundTrip<unsigned_long,double>(double value)

{
  double dVar1;
  undefined1 auVar2 [16];
  Fault local_20;
  Fault f;
  unsigned_long result;
  double value_local;
  
  f.exception = (Exception *)
                ((long)value | (long)(value - 9.223372036854776e+18) & (long)value >> 0x3f);
  auVar2._8_4_ = (int)((ulong)f.exception >> 0x20);
  auVar2._0_8_ = f.exception;
  auVar2._12_4_ = 0x45300000;
  dVar1 = (auVar2._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)f.exception) - 4503599627370496.0);
  if ((dVar1 != value) || (NAN(dVar1) || NAN(value))) {
    result = (unsigned_long)value;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],double&>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x6ca,FAILED,"U(result) == value",
               "\"Value out-of-range for requested type.\", value",
               (char (*) [39])"Value out-of-range for requested type.",(double *)&result);
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  return (unsigned_long)f.exception;
}

Assistant:

T checkRoundTrip(U value) {
#if __aarch64__
  // Work around an apparently broken compiler optimization on Clang / arm64. It appears that
  // for T = int8_t, U = double, and value = 128, the compiler incorrectly believes that the
  // round-trip does not change the value, where in fact it should change to -128. Similar problems
  // exist for various other types and inputs -- json-test seems to exercise several problem cases.
  // The problem only exists when compiling with optimization. In any case, declaring the variable
  // `volatile` kills the optimization.
  volatile
#endif
  T result = value;
  KJ_REQUIRE(U(result) == value, "Value out-of-range for requested type.", value) {
    // Use it anyway.
    break;
  }
  return result;
}